

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O2

void __thiscall Assimp::FBX::FBXExportProperty::FBXExportProperty(FBXExportProperty *this,bool v)

{
  undefined8 in_RAX;
  undefined1 auStack_8 [7];
  bool local_1;
  
  this->type = 'C';
  _auStack_8 = CONCAT17(v,SUB87(in_RAX,0));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->data,1,&local_1,(allocator_type *)(auStack_8 + 6));
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(bool v)
: type('C')
, data(1, uint8_t(v)) {}